

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O2

size_t dg::vr::limitingBorder(ValueRelations *relations,Value *val)

{
  Relations *rels;
  size_t sVar1;
  _Base_ptr p_Var2;
  _Base_bitset<1UL> local_60;
  Value *val_local;
  _Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
  local_50;
  
  local_60._M_w = 0;
  val_local = val;
  rels = Relations::sle((Relations *)&local_60);
  ValueRelations::getRelated<llvm::Value_const*>
            ((RelationsMap *)&local_50,relations,&val_local,rels);
  p_Var2 = local_50._M_impl.super__Rb_tree_header._M_header._M_left;
  while ((sVar1 = 0xffffffffffffffff,
         (_Rb_tree_header *)p_Var2 != &local_50._M_impl.super__Rb_tree_header &&
         (sVar1 = ValueRelations::getBorderId(relations,*(Handle *)(p_Var2 + 1)),
         sVar1 == 0xffffffffffffffff))) {
    p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
  }
  std::
  _Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
  ::~_Rb_tree(&local_50);
  return sVar1;
}

Assistant:

size_t limitingBorder(const ValueRelations &relations, const llvm::Value *val) {
    for (const auto &handleRel : relations.getRelated(val, Relations().sle())) {
        auto mId = relations.getBorderId(handleRel.first);
        if (mId != std::string::npos)
            return mId;
    }
    return std::string::npos;
}